

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O1

void __thiscall
polyscope::render::backend_openGL3_glfw::GLFrameBuffer::addColorBuffer
          (GLFrameBuffer *this,shared_ptr<polyscope::render::TextureBuffer> *textureBufferIn)

{
  int *piVar1;
  uint uVar2;
  element_type *peVar3;
  PFNGLBINDTEXTUREPROC p_Var4;
  GLenum GVar5;
  GLTextureBuffer *this_00;
  runtime_error *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  shared_ptr<polyscope::render::TextureBuffer> local_30;
  
  peVar3 = (textureBufferIn->
           super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar3 == (element_type *)0x0) {
    this_00 = (GLTextureBuffer *)0x0;
  }
  else {
    this_00 = (GLTextureBuffer *)
              __dynamic_cast(peVar3,&TextureBuffer::typeinfo,&GLTextureBuffer::typeinfo,0);
  }
  if (this_00 == (GLTextureBuffer *)0x0) {
    this_00 = (GLTextureBuffer *)0x0;
    this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    this_02 = (textureBufferIn->
              super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_02->_M_use_count = this_02->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_02->_M_use_count = this_02->_M_use_count + 1;
      }
    }
  }
  p_Var4 = glad_glBindTexture;
  if (this_00 == (GLTextureBuffer *)0x0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"tried to bind to non-GL texture buffer");
  }
  else {
    GVar5 = GLTextureBuffer::textureType(this_00);
    (*p_Var4)(GVar5,this_00->handle);
    checkGLError(true);
    (*(this->super_FrameBuffer)._vptr_FrameBuffer[2])(this);
    checkGLError(true);
    uVar2 = (this->super_FrameBuffer).nColorBuffers;
    if (uVar2 < 8) {
      (*glad_glFramebufferTexture2D)(0x8d40,uVar2 | 0x8ce0,0xde1,this_00->handle,0);
      checkGLError(true);
      if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_02->_M_use_count = this_02->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_02->_M_use_count = this_02->_M_use_count + 1;
        }
      }
      local_30.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = &this_00->super_TextureBuffer;
      local_30.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = this_02;
      std::
      vector<std::shared_ptr<polyscope::render::TextureBuffer>,std::allocator<std::shared_ptr<polyscope::render::TextureBuffer>>>
      ::emplace_back<std::shared_ptr<polyscope::render::TextureBuffer>>
                ((vector<std::shared_ptr<polyscope::render::TextureBuffer>,std::allocator<std::shared_ptr<polyscope::render::TextureBuffer>>>
                  *)&(this->super_FrameBuffer).textureBuffersColor,&local_30);
      if (local_30.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_30.
                   super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      piVar1 = &(this->super_FrameBuffer).nColorBuffers;
      *piVar1 = *piVar1 + 1;
      if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
      }
      return;
    }
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"tried to use too many color attachments");
  }
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void GLFrameBuffer::addColorBuffer(std::shared_ptr<TextureBuffer> textureBufferIn) {

  // it _better_ be a GL buffer
  std::shared_ptr<GLTextureBuffer> textureBuffer = std::dynamic_pointer_cast<GLTextureBuffer>(textureBufferIn);
  if (!textureBuffer) throw std::runtime_error("tried to bind to non-GL texture buffer");

  textureBuffer->bind();
  bind();
  checkGLError();

  glFramebufferTexture2D(GL_FRAMEBUFFER, colorAttachNum(nColorBuffers), GL_TEXTURE_2D, textureBuffer->getHandle(), 0);

  checkGLError();
  textureBuffersColor.push_back(textureBuffer);
  nColorBuffers++;
}